

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_pushresult(luaL_Buffer *B)

{
  lua_State *L_00;
  lua_State *L;
  luaL_Buffer *B_local;
  
  L_00 = B->L;
  lua_pushlstring(L_00,B->b,B->n);
  if ((anon_union_1024_6_fd43c7cc_for_init *)B->b != &B->init) {
    lua_closeslot(L_00,-2);
  }
  lua_rotate(L_00,-2,-1);
  lua_settop(L_00,-2);
  return;
}

Assistant:

LUALIB_API void luaL_pushresult (luaL_Buffer *B) {
  lua_State *L = B->L;
  checkbufferlevel(B, -1);
  lua_pushlstring(L, B->b, B->n);
  if (buffonstack(B))
    lua_closeslot(L, -2);  /* close the box */
  lua_remove(L, -2);  /* remove box or placeholder from the stack */
}